

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O0

void lowbd_inv_txfm2d_add_v_identity_avx2
               (int32_t *input,uint8_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size,int eob)

{
  byte in_CL;
  byte in_R8B;
  int in_R9D;
  int j_2;
  int j_1;
  __m256i temp [16];
  int j;
  __m256i *_buf1;
  __m256i buf0 [64];
  int i;
  int lr_flip;
  int ud_flip;
  transform_1d_avx2 row_txfm;
  int fun_idx_x;
  int rect_type;
  int input_stride;
  int buf_size_nonzero_w;
  int buf_size_h_div16;
  int buf_size_w_div16;
  int txfm_size_row;
  int txfm_size_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  int eoby;
  int eobx;
  __m256i buf1 [64];
  int in_stack_ffffffffffffed04;
  __m256i *in_stack_ffffffffffffed08;
  int stride_00;
  int in_stack_ffffffffffffed18;
  int in_stack_ffffffffffffed1c;
  longlong local_12e0 [3];
  int in_stack_ffffffffffffed3c;
  int in_stack_ffffffffffffed40;
  int in_stack_ffffffffffffed44;
  __m256i *in_stack_ffffffffffffed48;
  int in_stack_ffffffffffffee54;
  int in_stack_ffffffffffffee58;
  int in_stack_ffffffffffffee5c;
  __m256i *in_stack_ffffffffffffee60;
  int in_stack_ffffffffffffee6c;
  uint8_t *in_stack_ffffffffffffee70;
  __m256i *in_stack_ffffffffffffeef8;
  __m256i *in_stack_ffffffffffffef00;
  int local_10cc;
  longlong local_10c0 [258];
  int local_8ac;
  int local_8a8;
  int local_8a4;
  transform_1d_avx2 local_8a0;
  int local_898;
  int local_894;
  int local_890;
  int local_88c;
  int local_888;
  int local_884;
  int local_880;
  int local_87c;
  int local_878;
  int local_874;
  int8_t *local_870;
  int local_868;
  int local_864 [519];
  byte local_46;
  byte local_45;
  
  local_46 = in_R8B;
  local_45 = in_CL;
  get_eobx_eoby_scan_v_identity(local_864,&local_868,in_R8B,in_R9D);
  local_870 = av1_inv_txfm_shift_ls[local_46];
  local_874 = get_txw_idx(local_46);
  local_878 = get_txh_idx(local_46);
  local_87c = tx_size_wide[local_46];
  local_880 = tx_size_high[local_46];
  local_884 = local_87c >> 4;
  local_888 = local_868 + 0x10 >> 4;
  local_88c = (local_864[0] + 8 >> 3) << 3;
  stride_00 = local_880;
  if (0x20 < local_880) {
    stride_00 = 0x20;
  }
  local_890 = stride_00;
  local_894 = get_rect_tx_log_ratio(local_87c,local_880);
  local_898 = lowbd_txfm_all_1d_zeros_idx[local_864[0]];
  local_8a0 = lowbd_txfm_all_1d_zeros_w16_arr[local_874][""[local_45]][local_898];
  get_flip_cfg(local_45,&local_8a4,&local_8a8);
  for (local_8ac = 0; local_8ac < local_888; local_8ac = local_8ac + 1) {
    load_buffer_32bit_to_16bit_w16_avx2
              ((int32_t *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18),stride_00,
               in_stack_ffffffffffffed08,in_stack_ffffffffffffed04);
    if ((local_894 == 1) || (local_894 == -1)) {
      round_shift_avx2(in_stack_ffffffffffffed48,
                       (__m256i *)CONCAT44(in_stack_ffffffffffffed44,in_stack_ffffffffffffed40),
                       in_stack_ffffffffffffed3c);
    }
    (*local_8a0)((__m256i *)local_10c0,(__m256i *)local_10c0);
    round_shift_16bit_w16_avx2
              (in_stack_ffffffffffffed48,in_stack_ffffffffffffed44,in_stack_ffffffffffffed40);
    if (local_8a8 == 0) {
      for (in_stack_ffffffffffffed1c = 0; in_stack_ffffffffffffed1c < local_884;
          in_stack_ffffffffffffed1c = in_stack_ffffffffffffed1c + 1) {
        transpose_16bit_16x16_avx2(in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8);
      }
    }
    else {
      for (local_10cc = 0; local_10cc < local_884; local_10cc = local_10cc + 1) {
        flip_buf_avx2((__m256i *)(local_10c0 + (long)(local_10cc << 4) * 4),(__m256i *)local_12e0,
                      0x10);
        transpose_16bit_16x16_avx2(in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8);
      }
    }
    for (in_stack_ffffffffffffed18 = 0; in_stack_ffffffffffffed18 < local_884;
        in_stack_ffffffffffffed18 = in_stack_ffffffffffffed18 + 1) {
      iidentity_col_16xn_avx2
                (in_stack_ffffffffffffee70,in_stack_ffffffffffffee6c,in_stack_ffffffffffffee60,
                 in_stack_ffffffffffffee5c,in_stack_ffffffffffffee58,in_stack_ffffffffffffee54);
    }
  }
  return;
}

Assistant:

static inline void lowbd_inv_txfm2d_add_v_identity_avx2(
    const int32_t *input, uint8_t *output, int stride, TX_TYPE tx_type,
    TX_SIZE tx_size, int eob) {
  __m256i buf1[64];
  int eobx, eoby;
  get_eobx_eoby_scan_v_identity(&eobx, &eoby, tx_size, eob);
  const int8_t *shift = av1_inv_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int txfm_size_col = tx_size_wide[tx_size];
  const int txfm_size_row = tx_size_high[tx_size];
  const int buf_size_w_div16 = txfm_size_col >> 4;
  const int buf_size_h_div16 = (eoby + 16) >> 4;
  const int buf_size_nonzero_w = ((eobx + 8) >> 3) << 3;
  const int input_stride = AOMMIN(32, txfm_size_row);
  const int rect_type = get_rect_tx_log_ratio(txfm_size_col, txfm_size_row);

  const int fun_idx_x = lowbd_txfm_all_1d_zeros_idx[eobx];
  const transform_1d_avx2 row_txfm =
      lowbd_txfm_all_1d_zeros_w16_arr[txw_idx][hitx_1d_tab[tx_type]][fun_idx_x];

  assert(row_txfm != NULL);

  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  for (int i = 0; i < buf_size_h_div16; i++) {
    __m256i buf0[64];
    load_buffer_32bit_to_16bit_w16_avx2(input + i * 16, input_stride, buf0,
                                        buf_size_nonzero_w);
    if (rect_type == 1 || rect_type == -1) {
      round_shift_avx2(buf0, buf0, buf_size_nonzero_w);  // rect special code
    }
    row_txfm(buf0, buf0);
    round_shift_16bit_w16_avx2(buf0, txfm_size_col, shift[0]);
    __m256i *_buf1 = buf1;
    if (lr_flip) {
      for (int j = 0; j < buf_size_w_div16; ++j) {
        __m256i temp[16];
        flip_buf_avx2(buf0 + 16 * j, temp, 16);
        transpose_16bit_16x16_avx2(temp,
                                   _buf1 + 16 * (buf_size_w_div16 - 1 - j));
      }
    } else {
      for (int j = 0; j < buf_size_w_div16; ++j) {
        transpose_16bit_16x16_avx2(buf0 + 16 * j, _buf1 + 16 * j);
      }
    }
    for (int j = 0; j < buf_size_w_div16; ++j) {
      iidentity_col_16xn_avx2(output + i * 16 * stride + j * 16, stride,
                              buf1 + j * 16, shift[1], 16, txh_idx);
    }
  }
}